

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  undefined4 uVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  REF_INT RVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  REF_INT RVar10;
  bool bVar11;
  uint uVar12;
  REF_INT RVar13;
  REF_INT RVar14;
  uint uVar15;
  REF_GRID pRVar16;
  undefined8 uVar17;
  REF_STATUS RVar18;
  REF_INT RVar19;
  ulong uVar20;
  char *pcVar21;
  int iVar22;
  long lVar23;
  int cell_edge;
  REF_NODE pRVar24;
  REF_INT *pRVar25;
  REF_INT nmark_1;
  REF_INT new_nodes [27];
  REF_INT nmark;
  REF_INT e5;
  REF_INT e4;
  REF_INT e3;
  REF_INT e2;
  REF_INT e1;
  REF_INT e0;
  double local_238;
  int local_22c;
  REF_NODE local_228;
  REF_BOOL local_220;
  uint local_21c;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  REF_DBL local_180;
  REF_DBL local_178;
  REF_DBL local_170;
  uint local_164;
  int local_160;
  REF_INT local_15c;
  REF_INT local_158;
  REF_INT local_154;
  REF_INT local_150;
  REF_INT local_14c;
  REF_INT local_148;
  REF_INT RStack_144;
  REF_INT RStack_140;
  REF_INT RStack_13c;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  REF_DBL local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  REF_DBL local_78;
  REF_NODE local_70;
  REF_GRID local_68;
  ulong local_60;
  double local_58;
  undefined8 uStack_50;
  REF_DBL local_48;
  undefined8 uStack_40;
  
  pRVar16 = ref_subdiv->grid;
  pRVar24 = pRVar16->node;
  uVar12 = ref_node_synchronize_globals(pRVar24);
  if (uVar12 == 0) {
    if (ref_subdiv->instrument != 0) {
      uVar12 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_164);
      if (uVar12 != 0) {
        uVar20 = (ulong)uVar12;
        pcVar21 = "count";
        uVar17 = 0x864;
        goto LAB_001d2588;
      }
      if (ref_subdiv->grid->mpi->id == 0) {
        printf(" %d edges marked before relaxation\n",(ulong)local_164);
      }
    }
    if (ref_subdiv->allow_geometry == 0) {
      uVar12 = ref_subdiv_unmark_geom_support(ref_subdiv);
      if (uVar12 == 0) {
        if ((ref_subdiv->new_mark_allowed == 0) ||
           (uVar12 = ref_subdiv_mark_relax(ref_subdiv), uVar12 == 0)) {
          uVar12 = ref_subdiv_unmark_geom_support(ref_subdiv);
          if (uVar12 == 0) {
            uVar12 = ref_subdiv_unmark_relax(ref_subdiv);
            if (uVar12 == 0) {
              uVar12 = ref_subdiv_test_impossible_marks(ref_subdiv);
              if (uVar12 == 0) {
                uVar12 = ref_subdiv_new_node(ref_subdiv);
                if (uVar12 == 0) goto LAB_001d39e0;
                uVar20 = (ulong)uVar12;
                pcVar21 = "new nodes";
                uVar17 = 0x87a;
              }
              else {
                uVar20 = (ulong)uVar12;
                pcVar21 = "possible";
                uVar17 = 0x879;
              }
            }
            else {
              uVar20 = (ulong)uVar12;
              pcVar21 = "relax marks";
              uVar17 = 0x878;
            }
          }
          else {
            uVar20 = (ulong)uVar12;
            pcVar21 = "all geom marks";
            uVar17 = 0x877;
          }
        }
        else {
          uVar20 = (ulong)uVar12;
          pcVar21 = "relax marks";
          uVar17 = 0x875;
        }
      }
      else {
        uVar20 = (ulong)uVar12;
        pcVar21 = "all geom marks";
        uVar17 = 0x873;
      }
    }
    else if (ref_subdiv->new_mark_allowed == 0) {
LAB_001d26b9:
      uVar12 = ref_subdiv_new_node(ref_subdiv);
      if (uVar12 == 0) {
        uVar20 = 0;
        local_70 = pRVar24;
        local_68 = pRVar16;
        do {
          local_220 = 0;
          uVar12 = ref_subdiv_unmark_relax(ref_subdiv);
          if (uVar12 != 0) {
            uVar20 = (ulong)uVar12;
            pcVar21 = "unmark relax inside neg tet";
            uVar17 = 0x334;
            goto LAB_001d3918;
          }
          pRVar16 = ref_subdiv->grid;
          ref_cell = pRVar16->cell[8];
          if (0 < ref_cell->max) {
            local_228 = pRVar16->node;
            iVar22 = 0;
            local_60 = uVar20;
            do {
              if (ref_cell->c2n[(long)iVar22 * (long)ref_cell->size_per] == -1) goto LAB_001d3139;
              RVar13 = ref_subdiv_map(ref_subdiv,ref_cell,iVar22);
              uVar12 = ref_cell_nodes(ref_cell,iVar22,&local_148);
              RVar4 = RStack_13c;
              RVar3 = RStack_140;
              RVar14 = RStack_144;
              RVar19 = local_148;
              if (uVar12 != 0) {
                uVar20 = (ulong)uVar12;
                pcVar21 = "nodes";
                uVar17 = 0x277;
                goto LAB_001d38ed;
              }
              RVar8 = RStack_144;
              if (RVar13 < 0x15) {
                if (RVar13 < 8) {
                  if ((1 < RVar13 - 1U) && (RVar13 != 4)) goto LAB_001d3139;
                }
                else if (RVar13 != 8) {
                  RVar19 = RStack_144;
                  RVar14 = local_148;
                  RVar7 = local_148;
                  RVar9 = RStack_140;
                  RVar10 = RStack_13c;
                  if (RVar13 == 0xb) goto LAB_001d2e9c;
                  if (RVar13 != 0x10) goto LAB_001d3139;
                }
LAB_001d2cf9:
                if (0 < ref_cell->edge_per) {
                  cell_edge = -1;
                  RVar19 = 0;
                  do {
                    pRVar25 = ref_subdiv->mark;
                    RVar14 = ref_subdiv_c2e(ref_subdiv,ref_cell,RVar19,iVar22);
                    if (pRVar25[RVar14] != 0) {
                      cell_edge = RVar19;
                    }
                    RVar19 = RVar19 + 1;
                  } while (RVar19 < ref_cell->edge_per);
                  if (cell_edge != -1) {
                    local_22c = iVar22;
                    RVar19 = ref_subdiv_c2e(ref_subdiv,ref_cell,cell_edge,iVar22);
                    pRVar24 = local_228;
                    local_1f8 = CONCAT44(RStack_144,local_148);
                    uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                    local_218 = (double)(long)RVar19;
                    *(REF_INT *)((long)&local_1f8 + (long)ref_cell->e2n[cell_edge * 2] * 4) =
                         ref_subdiv->node[(long)local_218];
                    uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,&local_238);
                    if (uVar12 == 0) {
                      local_208 = pRVar24->min_volume;
                      local_c8 = local_238;
                      local_1f8 = CONCAT44(RStack_144,local_148);
                      uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                      *(REF_INT *)
                       ((long)&local_1f8 + (long)ref_cell->e2n[(int)(cell_edge * 2 | 1)] * 4) =
                           ref_subdiv->node[(long)local_218];
                      uVar12 = ref_node_tet_vol(pRVar24,(REF_INT *)&local_1f8,&local_238);
                      if (uVar12 == 0) {
                        bVar11 = local_c8 < local_208;
                        iVar22 = local_22c;
                        if (pRVar24->min_volume <= local_238) {
LAB_001d3100:
                          if (!bVar11) goto LAB_001d3139;
                        }
LAB_001d3104:
                        local_220 = 1;
                        if (0 < ref_cell->edge_per) {
                          RVar19 = 0;
                          do {
                            pRVar25 = ref_subdiv->mark;
                            RVar14 = ref_subdiv_c2e(ref_subdiv,ref_cell,RVar19,iVar22);
                            pRVar25[RVar14] = 0;
                            RVar19 = RVar19 + 1;
                          } while (RVar19 < ref_cell->edge_per);
                        }
                        goto LAB_001d3139;
                      }
                      uVar20 = (ulong)uVar12;
                      pcVar21 = "split vol";
                      uVar17 = 0x292;
                    }
                    else {
                      uVar20 = (ulong)uVar12;
                      pcVar21 = "split vol";
                      uVar17 = 0x28c;
                    }
                    goto LAB_001d38ed;
                  }
                }
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x286,"ref_subdiv_unmark_neg_tet_geom_support","edge not found");
                uVar20 = 1;
LAB_001d38f7:
                pcVar21 = "neg geom";
                uVar17 = 0x337;
                goto LAB_001d3918;
              }
              if (RVar13 < 0x26) {
                if (RVar13 == 0x15) {
                  local_148 = RStack_144;
                  RStack_144 = RVar19;
                  RStack_140 = RVar14;
                  RStack_13c = RVar3;
                  RVar7 = local_148;
                  RVar8 = RStack_144;
                  RVar9 = RStack_140;
                  RVar10 = RStack_13c;
                  goto LAB_001d2e9c;
                }
                if (RVar13 == 0x20) goto LAB_001d2cf9;
              }
              else {
                RVar19 = RStack_13c;
                RVar14 = RStack_140;
                RVar7 = RStack_140;
                RVar9 = local_148;
                RVar10 = RStack_144;
                if ((RVar13 == 0x26) ||
                   (RVar19 = RStack_140, RVar14 = RStack_13c, RVar7 = RStack_144, RVar8 = RStack_140
                   , RVar9 = RStack_144, RVar10 = local_148, RVar13 == 0x38)) {
LAB_001d2e9c:
                  RStack_13c = RVar10;
                  RStack_140 = RVar9;
                  RStack_144 = RVar8;
                  local_148 = RVar7;
                  pRVar25 = (REF_INT *)((long)&local_1f8 + 4);
                  local_1f8 = CONCAT44(RStack_144,local_148);
                  uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                  uVar12 = ref_subdiv_node_between(ref_subdiv,RVar14,RVar19,pRVar25);
                  if (uVar12 == 0) {
                    uVar12 = ref_subdiv_node_between
                                       (ref_subdiv,local_148,RStack_140,(REF_INT *)&uStack_1f0);
                    pRVar24 = local_228;
                    if (uVar12 == 0) {
                      local_22c = iVar22;
                      uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,&local_238);
                      if (uVar12 == 0) {
                        local_218 = pRVar24->min_volume;
                        local_208 = local_238;
                        local_1f8 = CONCAT44(RStack_144,local_148);
                        uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                        uVar12 = ref_subdiv_node_between
                                           (ref_subdiv,RStack_144,local_148,(REF_INT *)&local_1f8);
                        if (uVar12 == 0) {
                          uVar12 = ref_subdiv_node_between
                                             (ref_subdiv,RStack_144,RStack_140,
                                              (REF_INT *)&uStack_1f0);
                          pRVar24 = local_228;
                          if (uVar12 == 0) {
                            uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,&local_238);
                            if (uVar12 == 0) {
                              local_d8 = pRVar24->min_volume;
                              uStack_d0 = 0;
                              local_c8 = local_238;
                              uStack_c0 = 0;
                              local_1f8 = CONCAT44(RStack_144,local_148);
                              uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                              uVar12 = ref_subdiv_node_between
                                                 (ref_subdiv,RStack_140,local_148,
                                                  (REF_INT *)&local_1f8);
                              if (uVar12 == 0) {
                                uVar12 = ref_subdiv_node_between
                                                   (ref_subdiv,RStack_140,RStack_144,pRVar25);
                                pRVar24 = local_228;
                                if (uVar12 == 0) {
                                  uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                            &local_238);
                                  if (uVar12 == 0) {
                                    bVar11 = local_208 < local_218;
                                    local_208 = pRVar24->min_volume;
                                    uStack_200 = 0;
                                    local_218 = local_238;
                                    uStack_210 = 0;
                                    local_1f8 = CONCAT44(RStack_144,local_148);
                                    uStack_1f0 = CONCAT44(RStack_13c,RStack_140);
                                    uVar12 = ref_subdiv_node_between
                                                       (ref_subdiv,local_148,RStack_144,
                                                        (REF_INT *)&local_1f8);
                                    if (uVar12 == 0) {
                                      uVar12 = ref_subdiv_node_between
                                                         (ref_subdiv,RStack_144,RStack_140,pRVar25);
                                      if (uVar12 == 0) {
                                        uVar12 = ref_subdiv_node_between
                                                           (ref_subdiv,RStack_140,local_148,
                                                            (REF_INT *)&uStack_1f0);
                                        pRVar24 = local_228;
                                        if (uVar12 == 0) {
                                          uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                                    &local_238);
                                          if (uVar12 == 0) {
                                            iVar22 = local_22c;
                                            if (pRVar24->min_volume <= local_238) {
                                              bVar11 = (local_218 < local_208 || local_c8 < local_d8
                                                       ) || bVar11;
                                              goto LAB_001d3100;
                                            }
                                            goto LAB_001d3104;
                                          }
                                          uVar20 = (ulong)uVar12;
                                          pcVar21 = "split vol";
                                          uVar17 = 0x2d4;
                                        }
                                        else {
                                          uVar20 = (ulong)uVar12;
                                          pcVar21 = "mis";
                                          uVar17 = 0x2d3;
                                        }
                                      }
                                      else {
                                        uVar20 = (ulong)uVar12;
                                        pcVar21 = "mis";
                                        uVar17 = 0x2d0;
                                      }
                                    }
                                    else {
                                      uVar20 = (ulong)uVar12;
                                      pcVar21 = "mis";
                                      uVar17 = 0x2cd;
                                    }
                                  }
                                  else {
                                    uVar20 = (ulong)uVar12;
                                    pcVar21 = "split vol";
                                    uVar17 = 0x2c6;
                                  }
                                }
                                else {
                                  uVar20 = (ulong)uVar12;
                                  pcVar21 = "mis";
                                  uVar17 = 0x2c5;
                                }
                              }
                              else {
                                uVar20 = (ulong)uVar12;
                                pcVar21 = "mis";
                                uVar17 = 0x2c2;
                              }
                            }
                            else {
                              uVar20 = (ulong)uVar12;
                              pcVar21 = "split vol";
                              uVar17 = 699;
                            }
                          }
                          else {
                            uVar20 = (ulong)uVar12;
                            pcVar21 = "mis";
                            uVar17 = 0x2ba;
                          }
                        }
                        else {
                          uVar20 = (ulong)uVar12;
                          pcVar21 = "mis";
                          uVar17 = 0x2b7;
                        }
                      }
                      else {
                        uVar20 = (ulong)uVar12;
                        pcVar21 = "split vol";
                        uVar17 = 0x2b0;
                      }
                    }
                    else {
                      uVar20 = (ulong)uVar12;
                      pcVar21 = "mis";
                      uVar17 = 0x2af;
                    }
                  }
                  else {
                    uVar20 = (ulong)uVar12;
                    pcVar21 = "mis";
                    uVar17 = 0x2ac;
                  }
LAB_001d38ed:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,uVar17,"ref_subdiv_unmark_neg_tet_geom_support",uVar20,pcVar21);
                  goto LAB_001d38f7;
                }
                if (RVar13 == 0x3f) {
                  local_22c = local_148;
                  local_170 = (REF_DBL)CONCAT44(local_170._4_4_,RStack_144);
                  uVar12 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_144,&local_14c);
                  if (uVar12 == 0) {
                    uVar12 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_140,&local_150);
                    if (uVar12 == 0) {
                      uVar12 = ref_subdiv_node_between(ref_subdiv,local_148,RStack_13c,&local_154);
                      if (uVar12 == 0) {
                        uVar12 = ref_subdiv_node_between
                                           (ref_subdiv,RStack_144,RStack_140,&local_158);
                        if (uVar12 == 0) {
                          uVar12 = ref_subdiv_node_between
                                             (ref_subdiv,RStack_144,RStack_13c,&local_15c);
                          if (uVar12 == 0) {
                            uVar12 = ref_subdiv_node_between
                                               (ref_subdiv,RStack_140,RStack_13c,&local_160);
                            if (uVar12 == 0) {
                              local_178 = (REF_DBL)CONCAT44(local_178._4_4_,RVar3);
                              local_180 = (REF_DBL)CONCAT44(local_180._4_4_,RVar4);
                              local_208 = (double)CONCAT44(local_208._4_4_,local_14c);
                              local_b8 = (double)CONCAT44(local_b8._4_4_,local_154);
                              local_1f8 = CONCAT44(local_154,local_14c);
                              local_218 = (double)CONCAT44(local_218._4_4_,local_150);
                              uStack_1f0 = CONCAT44(local_22c,local_150);
                              uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,&local_238);
                              if (uVar12 == 0) {
                                local_78 = local_228->min_volume;
                                local_80 = local_238;
                                local_c8 = (double)CONCAT44(local_c8._4_4_,local_158);
                                local_1f8 = CONCAT44(local_158,SUB84(local_208,0));
                                local_d8 = (double)CONCAT44(local_d8._4_4_,local_15c);
                                uStack_1f0 = CONCAT44(local_170._0_4_,local_15c);
                                uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,&local_238
                                                         );
                                if (uVar12 == 0) {
                                  local_170 = local_228->min_volume;
                                  local_88 = local_238;
                                  local_22c = local_160;
                                  local_1f8 = CONCAT44(local_160,SUB84(local_218,0));
                                  uStack_1f0 = CONCAT44(local_178._0_4_,SUB84(local_c8,0));
                                  uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                            &local_238);
                                  if (uVar12 == 0) {
                                    local_178 = local_228->min_volume;
                                    local_90 = local_238;
                                    uVar6 = local_b8._0_4_;
                                    local_1f8 = CONCAT44(local_d8._0_4_,local_b8._0_4_);
                                    uStack_1f0 = CONCAT44(local_180._0_4_,local_22c);
                                    uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                              &local_238);
                                    if (uVar12 == 0) {
                                      local_180 = local_228->min_volume;
                                      local_98 = local_238;
                                      uVar2 = SUB84(local_208,0);
                                      local_1f8 = CONCAT44(local_22c,uVar2);
                                      uStack_1f0 = CONCAT44(uVar6,SUB84(local_218,0));
                                      uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                                &local_238);
                                      if (uVar12 == 0) {
                                        local_a0 = local_228->min_volume;
                                        local_a8 = local_238;
                                        local_1f8 = CONCAT44(local_22c,uVar2);
                                        uVar5 = local_d8._0_4_;
                                        uStack_1f0 = CONCAT44(local_d8._0_4_,uVar6);
                                        uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                                  &local_238);
                                        if (uVar12 == 0) {
                                          local_48 = local_228->min_volume;
                                          uStack_40 = 0;
                                          local_b8 = local_238;
                                          uStack_b0 = 0;
                                          local_1f8 = CONCAT44(local_22c,uVar2);
                                          uVar6 = local_c8._0_4_;
                                          uStack_1f0 = CONCAT44(local_c8._0_4_,uVar5);
                                          uVar12 = ref_node_tet_vol(local_228,(REF_INT *)&local_1f8,
                                                                    &local_238);
                                          pRVar24 = local_228;
                                          if (uVar12 == 0) {
                                            local_58 = local_228->min_volume;
                                            uStack_50 = 0;
                                            local_d8 = local_238;
                                            uStack_d0 = 0;
                                            local_1f8 = CONCAT44(local_22c,uVar2);
                                            uStack_1f0 = CONCAT44(local_218._0_4_,uVar6);
                                            uVar12 = ref_node_tet_vol(local_228,
                                                                      (REF_INT *)&local_1f8,
                                                                      &local_238);
                                            if (uVar12 == 0) {
                                              if (pRVar24->min_volume <= local_238) {
                                                bVar11 = (local_88 < local_170 ||
                                                         local_80 < local_78) ||
                                                         (((local_a8 < local_a0 ||
                                                           local_98 < local_180) ||
                                                          local_90 < local_178) ||
                                                         (local_d8 < local_58 || local_b8 < local_48
                                                         ));
                                                goto LAB_001d3100;
                                              }
                                              goto LAB_001d3104;
                                            }
                                            uVar20 = (ulong)uVar12;
                                            pcVar21 = "split vol";
                                            uVar17 = 0x318;
                                          }
                                          else {
                                            uVar20 = (ulong)uVar12;
                                            pcVar21 = "split vol";
                                            uVar17 = 0x311;
                                          }
                                        }
                                        else {
                                          uVar20 = (ulong)uVar12;
                                          pcVar21 = "split vol";
                                          uVar17 = 0x30a;
                                        }
                                      }
                                      else {
                                        uVar20 = (ulong)uVar12;
                                        pcVar21 = "split vol";
                                        uVar17 = 0x303;
                                      }
                                    }
                                    else {
                                      uVar20 = (ulong)uVar12;
                                      pcVar21 = "split vol";
                                      uVar17 = 0x2fc;
                                    }
                                  }
                                  else {
                                    uVar20 = (ulong)uVar12;
                                    pcVar21 = "split vol";
                                    uVar17 = 0x2f5;
                                  }
                                }
                                else {
                                  uVar20 = (ulong)uVar12;
                                  pcVar21 = "split vol";
                                  uVar17 = 0x2ee;
                                }
                              }
                              else {
                                uVar20 = (ulong)uVar12;
                                pcVar21 = "split vol";
                                uVar17 = 0x2e7;
                              }
                            }
                            else {
                              uVar20 = (ulong)uVar12;
                              pcVar21 = "e";
                              uVar17 = 0x2e2;
                            }
                          }
                          else {
                            uVar20 = (ulong)uVar12;
                            pcVar21 = "e";
                            uVar17 = 0x2e1;
                          }
                        }
                        else {
                          uVar20 = (ulong)uVar12;
                          pcVar21 = "e";
                          uVar17 = 0x2e0;
                        }
                      }
                      else {
                        uVar20 = (ulong)uVar12;
                        pcVar21 = "e";
                        uVar17 = 0x2df;
                      }
                    }
                    else {
                      uVar20 = (ulong)uVar12;
                      pcVar21 = "e";
                      uVar17 = 0x2de;
                    }
                  }
                  else {
                    uVar20 = (ulong)uVar12;
                    pcVar21 = "e";
                    uVar17 = 0x2dd;
                  }
                  goto LAB_001d38ed;
                }
              }
LAB_001d3139:
              iVar22 = iVar22 + 1;
            } while (iVar22 < ref_cell->max);
            pRVar16 = ref_subdiv->grid;
            uVar20 = local_60;
          }
          uVar12 = ref_edge_ghost_min_int(ref_subdiv->edge,pRVar16->mpi,ref_subdiv->mark);
          if (uVar12 != 0) {
            uVar20 = (ulong)uVar12;
            pcVar21 = "ghost mark";
            uVar17 = 0x33c;
            goto LAB_001d3918;
          }
          uVar12 = (uint)uVar20 + 1;
          if (4 < (uint)uVar20) {
            uVar15 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_21c);
            if (uVar15 != 0) {
              uVar20 = (ulong)uVar15;
              pcVar21 = "count";
              uVar17 = 0x33f;
              goto LAB_001d3918;
            }
            if (ref_subdiv->grid->mpi->id == 0) {
              printf(" %d edges marked after %d unmark neg geom tet relaxations\n",(ulong)local_21c,
                     (ulong)uVar12);
            }
            if (uVar12 == 200) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x345,"ref_subdiv_unmark_neg_tet_relax",
                     "too many unmark neg geom tet sweeps, stop inf loop");
              uVar20 = 1;
              goto LAB_001d3922;
            }
          }
          uVar15 = ref_mpi_all_or(ref_subdiv->grid->mpi,&local_220);
          if (uVar15 != 0) {
            uVar20 = (ulong)uVar15;
            pcVar21 = "mpi all or";
            uVar17 = 0x347;
            goto LAB_001d3918;
          }
          uVar20 = (ulong)uVar12;
        } while (local_220 != 0);
        uVar15 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
        if (uVar15 == 0) {
          if (ref_subdiv->instrument != 0) {
            uVar15 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_21c);
            if (uVar15 != 0) {
              uVar20 = (ulong)uVar15;
              pcVar21 = "count";
              uVar17 = 0x350;
              goto LAB_001d3918;
            }
            if (ref_subdiv->grid->mpi->id == 0) {
              printf(" %d edges marked after %d neg geom tet unmark relaxations\n",(ulong)local_21c,
                     (ulong)uVar12);
            }
          }
          uVar12 = ref_subdiv_test_impossible_marks(ref_subdiv);
          if (uVar12 == 0) {
            uVar12 = ref_subdiv_new_node(ref_subdiv);
            pRVar24 = local_70;
            pRVar16 = local_68;
            if (uVar12 == 0) {
LAB_001d39e0:
              uVar12 = ref_subdiv_split_tet(ref_subdiv);
              if (uVar12 == 0) {
                uVar12 = ref_subdiv_split_pri(ref_subdiv);
                if (uVar12 == 0) {
                  uVar12 = ref_subdiv_split_pyr(ref_subdiv);
                  if (uVar12 == 0) {
                    uVar12 = ref_subdiv_split_qua(ref_subdiv);
                    if (uVar12 == 0) {
                      uVar12 = ref_subdiv_split_tri(ref_subdiv);
                      if (uVar12 == 0) {
                        uVar12 = ref_subdiv_split_edg(ref_subdiv);
                        if (uVar12 == 0) {
                          iVar22 = pRVar24->max;
                          if (iVar22 < 1) {
                            return 0;
                          }
                          lVar23 = 0;
                          while (((pRVar24->global[lVar23] < 0 ||
                                  ((pRVar1 = pRVar16->cell[8]->ref_adj, lVar23 < pRVar1->nnode &&
                                   (pRVar1->first[lVar23] != -1)))) ||
                                 (((pRVar1 = pRVar16->cell[9]->ref_adj, lVar23 < pRVar1->nnode &&
                                   (pRVar1->first[lVar23] != -1)) ||
                                  (((pRVar1 = pRVar16->cell[10]->ref_adj, lVar23 < pRVar1->nnode &&
                                    (pRVar1->first[lVar23] != -1)) ||
                                   ((pRVar1 = pRVar16->cell[0xb]->ref_adj, lVar23 < pRVar1->nnode &&
                                    (pRVar1->first[lVar23] != -1))))))))) {
LAB_001d3c2d:
                            lVar23 = lVar23 + 1;
                            if (iVar22 <= lVar23) {
                              return 0;
                            }
                          }
                          if (ref_subdiv->grid->mpi->id == pRVar24->part[lVar23]) {
                            pcVar21 = "unused local node";
                            uVar17 = 0x890;
                          }
                          else {
                            pRVar1 = pRVar16->cell[3]->ref_adj;
                            if (((pRVar1->nnode <= lVar23) || (pRVar1->first[lVar23] == -1)) &&
                               ((pRVar1 = pRVar16->cell[6]->ref_adj, pRVar1->nnode <= lVar23 ||
                                (pRVar1->first[lVar23] == -1)))) {
                              uVar12 = ref_node_remove_without_global(pRVar24,(REF_INT)lVar23);
                              if (uVar12 == 0) {
                                uVar12 = ref_geom_remove_all(pRVar16->geom,(REF_INT)lVar23);
                                if (uVar12 == 0) {
                                  iVar22 = pRVar24->max;
                                  goto LAB_001d3c2d;
                                }
                                uVar20 = (ulong)uVar12;
                                pcVar21 = "rm";
                                uVar17 = 0x897;
                              }
                              else {
                                uVar20 = (ulong)uVar12;
                                pcVar21 = "rm";
                                uVar17 = 0x896;
                              }
                              goto LAB_001d2588;
                            }
                            pcVar21 = "boundary face node not in vol cells";
                            uVar17 = 0x894;
                          }
                          RVar18 = 1;
                          uVar20 = 1;
                          goto LAB_001d258b;
                        }
                        uVar20 = (ulong)uVar12;
                        pcVar21 = "split edg";
                        uVar17 = 0x886;
                      }
                      else {
                        uVar20 = (ulong)uVar12;
                        pcVar21 = "split tri";
                        uVar17 = 0x884;
                      }
                    }
                    else {
                      uVar20 = (ulong)uVar12;
                      pcVar21 = "split qua";
                      uVar17 = 0x882;
                    }
                  }
                  else {
                    uVar20 = (ulong)uVar12;
                    pcVar21 = "split pyr";
                    uVar17 = 0x880;
                  }
                }
                else {
                  uVar20 = (ulong)uVar12;
                  pcVar21 = "split pri";
                  uVar17 = 0x87e;
                }
              }
              else {
                uVar20 = (ulong)uVar12;
                pcVar21 = "split tet";
                uVar17 = 0x87d;
              }
            }
            else {
              uVar20 = (ulong)uVar12;
              pcVar21 = "new nodes";
              uVar17 = 0x871;
            }
          }
          else {
            uVar20 = (ulong)uVar12;
            pcVar21 = "possible";
            uVar17 = 0x870;
          }
        }
        else {
          uVar20 = (ulong)uVar15;
          pcVar21 = "ghost mark";
          uVar17 = 0x34d;
LAB_001d3918:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 uVar17,"ref_subdiv_unmark_neg_tet_relax",uVar20,pcVar21);
LAB_001d3922:
          pcVar21 = "geom neg marks";
          uVar17 = 0x86f;
        }
      }
      else {
        uVar20 = (ulong)uVar12;
        pcVar21 = "new nodes";
        uVar17 = 0x86e;
      }
    }
    else {
      uVar12 = ref_subdiv_mark_relax(ref_subdiv);
      if (uVar12 == 0) {
        uVar12 = ref_subdiv_test_impossible_marks(ref_subdiv);
        if (uVar12 == 0) goto LAB_001d26b9;
        uVar20 = (ulong)uVar12;
        pcVar21 = "possible";
        uVar17 = 0x86c;
      }
      else {
        uVar20 = (ulong)uVar12;
        pcVar21 = "relax marks";
        uVar17 = 0x86b;
      }
    }
  }
  else {
    uVar20 = (ulong)uVar12;
    pcVar21 = "sync glob for mark relax";
    uVar17 = 0x861;
  }
LAB_001d2588:
  RVar18 = (REF_STATUS)uVar20;
LAB_001d258b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar17,
         "ref_subdiv_split",uVar20,pcVar21);
  return RVar18;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_split(REF_SUBDIV ref_subdiv) {
  REF_GRID ref_grid = ref_subdiv_grid(ref_subdiv);
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_INT node;
  REF_INT nmark;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob for mark relax");

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked before relaxation\n", nmark);
  }

  if (ref_subdiv->allow_geometry) {
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
      RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    }
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
    RSS(ref_subdiv_unmark_neg_tet_relax(ref_subdiv), "geom neg marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  } else {
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    if (ref_subdiv_new_mark_allowed(ref_subdiv)) {
      RSS(ref_subdiv_mark_relax(ref_subdiv), "relax marks");
    }
    RSS(ref_subdiv_unmark_geom_support(ref_subdiv), "all geom marks");
    RSS(ref_subdiv_unmark_relax(ref_subdiv), "relax marks");
    RSS(ref_subdiv_test_impossible_marks(ref_subdiv), "possible");
    RSS(ref_subdiv_new_node(ref_subdiv), "new nodes");
  }

  RSS(ref_subdiv_split_tet(ref_subdiv), "split tet");
  RSS(ref_subdiv_split_pri(ref_subdiv), "split pri");
  /* pyr comes last, it can make other elements too */
  RSS(ref_subdiv_split_pyr(ref_subdiv), "split pyr");

  RSS(ref_subdiv_split_qua(ref_subdiv), "split qua");
  /* tri comes last, it can make qua elements too */
  RSS(ref_subdiv_split_tri(ref_subdiv), "split tri");

  RSS(ref_subdiv_split_edg(ref_subdiv), "split edg");

  /* remove unused nodes on partition boundaries */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      if (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
          ref_node_part(ref_node, node)) {
        RSS(REF_FAILURE, "unused local node");
      }
      if (!ref_adj_empty(ref_cell_adj(ref_grid_tri(ref_grid)), node) ||
          !ref_adj_empty(ref_cell_adj(ref_grid_qua(ref_grid)), node)) {
        RSS(REF_FAILURE, "boundary face node not in vol cells");
      }
      RSS(ref_node_remove_without_global(ref_node, node), "rm");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm");
    }
  }

  return REF_SUCCESS;
}